

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O0

void diy::mpi::detail::gather_v
               (communicator *comm,void *dataIn,int countIn,datatype *type,void *dataOut,int *counts
               ,int *offsets,int root)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Comm *ppoVar4;
  DIY_MPI_Datatype *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  communicator *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  DIY_MPI_Comm local_38;
  undefined8 local_30;
  undefined8 local_28;
  DIY_MPI_Datatype *local_20;
  communicator *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  ppoVar3 = mpi_cast(in_RCX);
  poVar1 = *ppoVar3;
  ppoVar3 = mpi_cast(local_20);
  poVar2 = *ppoVar3;
  local_38 = communicator::handle(local_8);
  ppoVar4 = mpi_cast(&local_38);
  MPI_Gatherv(in_RSI,in_EDX,poVar1,local_28,local_30,in_stack_00000008,poVar2,in_stack_00000010,
              *ppoVar4);
  return;
}

Assistant:

void gather_v(const communicator& comm,
              const void* dataIn, int countIn, const datatype& type,
              void* dataOut, const int counts[], const int offsets[],
              int root)
{
#if DIY_HAS_MPI
  MPI_Gatherv(dataIn, countIn, mpi_cast(type.handle),
              dataOut, counts, offsets, mpi_cast(type.handle),
              root, mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), countIn);
  (void)comm; (void)counts, (void)offsets, (void)root;
#endif
}